

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

string * __thiscall
NJamSpell::DumpKey<std::pair<unsigned_int,unsigned_int>>
          (string *__return_storage_ptr__,NJamSpell *this,pair<unsigned_int,_unsigned_int> *key)

{
  char local_1b0 [8];
  ostream out;
  code *local_a0;
  stringbuf buf;
  locale local_68 [8];
  undefined4 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  string *local_38;
  
  local_a0 = __assert_fail;
  _buf = 0;
  local_38 = __return_storage_ptr__;
  std::locale::locale(local_68);
  local_a0 = std::locale::locale;
  local_60 = 0x18;
  local_50 = 0;
  local_48[0] = 0;
  local_58 = local_48;
  std::ostream::ostream(local_1b0,(streambuf *)&local_a0);
  std::ostream::write(local_1b0,(long)this);
  std::ostream::write(local_1b0,(long)(this + 4));
  std::__cxx11::stringbuf::str();
  std::ios_base::~ios_base((ios_base *)&out);
  local_a0 = std::locale::locale;
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_a0 = __assert_fail;
  std::locale::~locale(local_68);
  return local_38;
}

Assistant:

std::string DumpKey(const T& key) {
    std::stringbuf buf;
    std::ostream out(&buf);
    NHandyPack::Dump(out, key);
    return buf.str();
}